

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void iadst16x16_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m128i *out0;
  byte bVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar20;
  int iVar24;
  undefined1 auVar17 [16];
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar32;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  undefined1 auVar33 [16];
  int iVar37;
  uint uVar38;
  int iVar43;
  uint uVar44;
  int iVar45;
  uint uVar46;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar47;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uint uVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  uint uVar53;
  uint uVar54;
  int iVar59;
  int iVar65;
  undefined1 auVar55 [16];
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  undefined1 auVar56 [16];
  uint uVar63;
  uint uVar69;
  uint uVar76;
  undefined1 auVar57 [16];
  uint uVar64;
  uint uVar70;
  uint uVar77;
  undefined1 auVar58 [16];
  undefined1 auVar78 [16];
  int iVar79;
  uint uVar80;
  int iVar83;
  uint uVar84;
  int iVar85;
  uint uVar86;
  undefined1 auVar81 [16];
  int iVar87;
  undefined1 auVar82 [16];
  uint uVar88;
  int iVar91;
  int iVar92;
  undefined1 auVar89 [16];
  int iVar93;
  undefined1 auVar90 [16];
  int iVar94;
  uint uVar95;
  int iVar98;
  uint uVar99;
  int iVar100;
  uint uVar101;
  undefined1 auVar96 [16];
  int iVar102;
  undefined1 auVar97 [16];
  uint uVar103;
  int iVar104;
  uint uVar105;
  uint uVar106;
  uint uVar107;
  int iVar112;
  int iVar116;
  undefined1 auVar108 [16];
  uint uVar113;
  uint uVar117;
  int iVar120;
  uint uVar121;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  uint uVar114;
  uint uVar115;
  uint uVar118;
  uint uVar119;
  uint uVar122;
  uint uVar123;
  undefined1 auVar111 [16];
  uint uVar124;
  uint uVar128;
  uint uVar129;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  uint uVar130;
  int iVar131;
  uint uVar132;
  int iVar137;
  int iVar139;
  undefined1 auVar133 [16];
  int iVar141;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  uint uVar138;
  uint uVar140;
  uint uVar142;
  undefined1 auVar136 [16];
  int iVar143;
  uint uVar144;
  int iVar149;
  int iVar151;
  int iVar153;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  uint uVar150;
  uint uVar152;
  uint uVar154;
  undefined1 auVar148 [16];
  int iVar155;
  uint uVar156;
  int iVar161;
  int iVar163;
  int iVar165;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  uint uVar162;
  uint uVar164;
  uint uVar166;
  undefined1 auVar160 [16];
  int iVar167;
  uint uVar168;
  int iVar171;
  uint uVar172;
  int iVar173;
  uint uVar174;
  undefined1 auVar169 [16];
  int iVar175;
  undefined1 auVar170 [16];
  uint uVar176;
  uint uVar177;
  uint uVar178;
  int iVar186;
  int iVar189;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  int iVar192;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  uint uVar187;
  uint uVar188;
  uint uVar190;
  uint uVar191;
  uint uVar193;
  uint uVar194;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  undefined1 auVar195 [16];
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  __m128i *out1;
  
  out0 = (__m128i *)(ulong)(uint)out_shift;
  lVar3 = (long)bit * 0x100;
  iVar6 = 1 << ((char)bit - 1U & 0x1f);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x168);
  auVar125._4_4_ = uVar1;
  auVar125._0_4_ = uVar1;
  auVar125._8_4_ = uVar1;
  auVar125._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 600);
  auVar81._4_4_ = uVar1;
  auVar81._0_4_ = uVar1;
  auVar81._8_4_ = uVar1;
  auVar81._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x188);
  auVar96._4_4_ = uVar1;
  auVar96._0_4_ = uVar1;
  auVar96._8_4_ = uVar1;
  auVar96._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x238);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1a8);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x218);
  auVar55._4_4_ = uVar1;
  auVar55._0_4_ = uVar1;
  auVar55._8_4_ = uVar1;
  auVar55._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1c8);
  auVar10._4_4_ = uVar1;
  auVar10._0_4_ = uVar1;
  auVar10._8_4_ = uVar1;
  auVar10._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1f8);
  auVar179._4_4_ = uVar1;
  auVar179._0_4_ = uVar1;
  auVar179._8_4_ = uVar1;
  auVar179._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1e8);
  auVar169._4_4_ = uVar1;
  auVar169._0_4_ = uVar1;
  auVar169._8_4_ = uVar1;
  auVar169._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1d8);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x208);
  auVar78._4_4_ = uVar1;
  auVar78._0_4_ = uVar1;
  auVar78._8_4_ = uVar1;
  auVar78._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1b8);
  auVar182._4_4_ = uVar1;
  auVar182._0_4_ = uVar1;
  auVar182._8_4_ = uVar1;
  auVar182._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x228);
  auVar89._4_4_ = uVar1;
  auVar89._0_4_ = uVar1;
  auVar89._8_4_ = uVar1;
  auVar89._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x198);
  auVar108 = pmulld(auVar81,(undefined1  [16])*in);
  auVar133 = pmulld(auVar125,(undefined1  [16])*in);
  auVar39 = pmulld(auVar39,(undefined1  [16])in[2]);
  auVar125 = pmulld(auVar96,(undefined1  [16])in[2]);
  auVar81 = pmulld(auVar55,(undefined1  [16])in[4]);
  auVar55 = pmulld(auVar40,(undefined1  [16])in[4]);
  auVar179 = pmulld(auVar179,(undefined1  [16])in[6]);
  auVar10 = pmulld(auVar10,(undefined1  [16])in[6]);
  auVar169 = pmulld(auVar169,(undefined1  [16])in[7]);
  auVar17 = pmulld(auVar17,(undefined1  [16])in[7]);
  auVar78 = pmulld(auVar78,(undefined1  [16])in[5]);
  auVar40 = pmulld(auVar182,(undefined1  [16])in[5]);
  auVar89 = pmulld(auVar89,(undefined1  [16])in[3]);
  auVar11._4_4_ = uVar1;
  auVar11._0_4_ = uVar1;
  auVar11._8_4_ = uVar1;
  auVar11._12_4_ = uVar1;
  auVar96 = pmulld(auVar11,(undefined1  [16])in[3]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x248);
  auVar126._4_4_ = uVar1;
  auVar126._0_4_ = uVar1;
  auVar126._8_4_ = uVar1;
  auVar126._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x178);
  auVar180._4_4_ = uVar1;
  auVar180._0_4_ = uVar1;
  auVar180._8_4_ = uVar1;
  auVar180._12_4_ = uVar1;
  auVar11 = pmulld(auVar126,(undefined1  [16])in[1]);
  auVar180 = pmulld(auVar180,(undefined1  [16])in[1]);
  auVar126 = ZEXT416((uint)bit);
  iVar104 = auVar108._0_4_ + iVar6 >> auVar126;
  iVar112 = auVar108._4_4_ + iVar6 >> auVar126;
  iVar116 = auVar108._8_4_ + iVar6 >> auVar126;
  iVar120 = auVar108._12_4_ + iVar6 >> auVar126;
  iVar167 = auVar169._0_4_ + iVar6 >> auVar126;
  iVar171 = auVar169._4_4_ + iVar6 >> auVar126;
  iVar173 = auVar169._8_4_ + iVar6 >> auVar126;
  iVar175 = auVar169._12_4_ + iVar6 >> auVar126;
  iVar49 = iVar167 + iVar104;
  iVar59 = iVar171 + iVar112;
  iVar65 = iVar173 + iVar116;
  iVar71 = iVar175 + iVar120;
  iVar104 = iVar104 - iVar167;
  iVar112 = iVar112 - iVar171;
  iVar116 = iVar116 - iVar173;
  iVar120 = iVar120 - iVar175;
  iVar155 = iVar6 - auVar133._0_4_ >> auVar126;
  iVar161 = iVar6 - auVar133._4_4_ >> auVar126;
  iVar163 = iVar6 - auVar133._8_4_ >> auVar126;
  iVar165 = iVar6 - auVar133._12_4_ >> auVar126;
  iVar167 = auVar17._0_4_ + iVar6 >> auVar126;
  iVar171 = auVar17._4_4_ + iVar6 >> auVar126;
  iVar173 = auVar17._8_4_ + iVar6 >> auVar126;
  iVar175 = auVar17._12_4_ + iVar6 >> auVar126;
  iVar50 = iVar167 + iVar155;
  iVar60 = iVar171 + iVar161;
  iVar66 = iVar173 + iVar163;
  iVar72 = iVar175 + iVar165;
  iVar155 = iVar155 - iVar167;
  iVar161 = iVar161 - iVar171;
  iVar163 = iVar163 - iVar173;
  iVar165 = iVar165 - iVar175;
  local_e8 = auVar39._0_4_;
  iStack_e4 = auVar39._4_4_;
  iStack_e0 = auVar39._8_4_;
  iStack_dc = auVar39._12_4_;
  iVar37 = local_e8 + iVar6 >> auVar126;
  iVar43 = iStack_e4 + iVar6 >> auVar126;
  iVar45 = iStack_e0 + iVar6 >> auVar126;
  iVar47 = iStack_dc + iVar6 >> auVar126;
  iVar167 = auVar78._0_4_ + iVar6 >> auVar126;
  iVar171 = auVar78._4_4_ + iVar6 >> auVar126;
  iVar173 = auVar78._8_4_ + iVar6 >> auVar126;
  iVar175 = auVar78._12_4_ + iVar6 >> auVar126;
  iVar13 = iVar167 + iVar37;
  iVar20 = iVar171 + iVar43;
  iVar24 = iVar173 + iVar45;
  iVar28 = iVar175 + iVar47;
  iVar37 = iVar37 - iVar167;
  iVar43 = iVar43 - iVar171;
  iVar45 = iVar45 - iVar173;
  iVar47 = iVar47 - iVar175;
  iVar143 = iVar6 - auVar125._0_4_ >> auVar126;
  iVar149 = iVar6 - auVar125._4_4_ >> auVar126;
  iVar151 = iVar6 - auVar125._8_4_ >> auVar126;
  iVar153 = iVar6 - auVar125._12_4_ >> auVar126;
  iVar167 = auVar40._0_4_ + iVar6 >> auVar126;
  iVar171 = auVar40._4_4_ + iVar6 >> auVar126;
  iVar173 = auVar40._8_4_ + iVar6 >> auVar126;
  iVar175 = auVar40._12_4_ + iVar6 >> auVar126;
  iVar14 = iVar167 + iVar143;
  iVar21 = iVar171 + iVar149;
  iVar25 = iVar173 + iVar151;
  iVar29 = iVar175 + iVar153;
  iVar143 = iVar143 - iVar167;
  iVar149 = iVar149 - iVar171;
  iVar151 = iVar151 - iVar173;
  iVar153 = iVar153 - iVar175;
  iVar167 = *(int *)((long)vert_filter_length_chroma + lVar3 + 0x240);
  iVar9 = -iVar167;
  iVar171 = *(int *)((long)vert_filter_length_chroma + lVar3 + 0x1c0);
  iVar173 = *(int *)((long)vert_filter_length_chroma + lVar3 + 0x220);
  iVar7 = -iVar171;
  iVar4 = -iVar173;
  iVar8 = bd + (uint)(do_cols == 0) * 2;
  iVar79 = auVar81._0_4_ + iVar6 >> auVar126;
  iVar83 = auVar81._4_4_ + iVar6 >> auVar126;
  iVar85 = auVar81._8_4_ + iVar6 >> auVar126;
  iVar87 = auVar81._12_4_ + iVar6 >> auVar126;
  iVar175 = auVar89._0_4_ + iVar6 >> auVar126;
  iVar91 = auVar89._4_4_ + iVar6 >> auVar126;
  iVar92 = auVar89._8_4_ + iVar6 >> auVar126;
  iVar93 = auVar89._12_4_ + iVar6 >> auVar126;
  iVar15 = iVar175 + iVar79;
  iVar22 = iVar91 + iVar83;
  iVar26 = iVar92 + iVar85;
  iVar30 = iVar93 + iVar87;
  iVar79 = iVar79 - iVar175;
  iVar83 = iVar83 - iVar91;
  iVar85 = iVar85 - iVar92;
  iVar87 = iVar87 - iVar93;
  iVar131 = iVar6 - auVar55._0_4_ >> auVar126;
  iVar137 = iVar6 - auVar55._4_4_ >> auVar126;
  iVar139 = iVar6 - auVar55._8_4_ >> auVar126;
  iVar141 = iVar6 - auVar55._12_4_ >> auVar126;
  iVar175 = auVar96._0_4_ + iVar6 >> auVar126;
  iVar91 = auVar96._4_4_ + iVar6 >> auVar126;
  iVar92 = auVar96._8_4_ + iVar6 >> auVar126;
  iVar93 = auVar96._12_4_ + iVar6 >> auVar126;
  iVar51 = iVar175 + iVar131;
  iVar61 = iVar91 + iVar137;
  iVar67 = iVar92 + iVar139;
  iVar73 = iVar93 + iVar141;
  iVar131 = iVar131 - iVar175;
  iVar137 = iVar137 - iVar91;
  iVar139 = iVar139 - iVar92;
  iVar141 = iVar141 - iVar93;
  iStack_134 = auVar179._4_4_;
  iStack_130 = auVar179._8_4_;
  iStack_12c = auVar179._12_4_;
  iVar52 = auVar179._0_4_ + iVar6 >> auVar126;
  iVar62 = iStack_134 + iVar6 >> auVar126;
  iVar68 = iStack_130 + iVar6 >> auVar126;
  iVar74 = iStack_12c + iVar6 >> auVar126;
  iVar175 = auVar11._0_4_ + iVar6 >> auVar126;
  iVar91 = auVar11._4_4_ + iVar6 >> auVar126;
  iVar92 = auVar11._8_4_ + iVar6 >> auVar126;
  iVar93 = auVar11._12_4_ + iVar6 >> auVar126;
  iVar16 = iVar175 + iVar52;
  iVar23 = iVar91 + iVar62;
  iVar27 = iVar92 + iVar68;
  iVar31 = iVar93 + iVar74;
  iVar52 = iVar52 - iVar175;
  iVar62 = iVar62 - iVar91;
  iVar68 = iVar68 - iVar92;
  iVar74 = iVar74 - iVar93;
  iVar91 = iVar6 - auVar10._0_4_ >> auVar126;
  iVar92 = iVar6 - auVar10._4_4_ >> auVar126;
  iVar93 = iVar6 - auVar10._8_4_ >> auVar126;
  iVar75 = iVar6 - auVar10._12_4_ >> auVar126;
  iVar175 = auVar180._0_4_ + iVar6 >> auVar126;
  iVar186 = auVar180._4_4_ + iVar6 >> auVar126;
  iVar189 = auVar180._8_4_ + iVar6 >> auVar126;
  iVar192 = auVar180._12_4_ + iVar6 >> auVar126;
  iVar94 = iVar175 + iVar91;
  iVar98 = iVar186 + iVar92;
  iVar100 = iVar189 + iVar93;
  iVar102 = iVar192 + iVar75;
  iVar91 = iVar91 - iVar175;
  iVar92 = iVar92 - iVar186;
  iVar93 = iVar93 - iVar189;
  iVar75 = iVar75 - iVar192;
  iVar175 = 0x8000;
  if (0xf < iVar8 + 6) {
    iVar175 = 1 << ((char)iVar8 + 5U & 0x1f);
  }
  uVar5 = -iVar175;
  out1 = (__m128i *)(ulong)uVar5;
  iVar175 = iVar175 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x180);
  auVar181._4_4_ = uVar1;
  auVar181._0_4_ = uVar1;
  auVar181._8_4_ = uVar1;
  auVar181._12_4_ = uVar1;
  auVar108._4_4_ = iVar167;
  auVar108._0_4_ = iVar167;
  auVar108._8_4_ = iVar167;
  auVar108._12_4_ = iVar167;
  uVar105 = (iVar104 < (int)uVar5) * uVar5 | (uint)(iVar104 >= (int)uVar5) * iVar104;
  uVar113 = (iVar112 < (int)uVar5) * uVar5 | (uint)(iVar112 >= (int)uVar5) * iVar112;
  uVar117 = (iVar116 < (int)uVar5) * uVar5 | (uint)(iVar116 >= (int)uVar5) * iVar116;
  uVar121 = (iVar120 < (int)uVar5) * uVar5 | (uint)(iVar120 >= (int)uVar5) * iVar120;
  auVar109._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar109._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar109._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar109._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar105 = (iVar155 < (int)uVar5) * uVar5 | (uint)(iVar155 >= (int)uVar5) * iVar155;
  uVar113 = (iVar161 < (int)uVar5) * uVar5 | (uint)(iVar161 >= (int)uVar5) * iVar161;
  uVar117 = (iVar163 < (int)uVar5) * uVar5 | (uint)(iVar163 >= (int)uVar5) * iVar163;
  uVar121 = (iVar165 < (int)uVar5) * uVar5 | (uint)(iVar165 >= (int)uVar5) * iVar165;
  auVar157._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar157._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar157._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar157._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  auVar180 = pmulld(auVar109,auVar108);
  auVar11 = pmulld(auVar108,auVar157);
  auVar78 = pmulld(auVar109,auVar181);
  auVar169 = pmulld(auVar157,auVar181);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x200);
  auVar18._4_4_ = uVar1;
  auVar18._0_4_ = uVar1;
  auVar18._8_4_ = uVar1;
  auVar18._12_4_ = uVar1;
  auVar158._4_4_ = iVar171;
  auVar158._0_4_ = iVar171;
  auVar158._8_4_ = iVar171;
  auVar158._12_4_ = iVar171;
  uVar105 = (iVar37 < (int)uVar5) * uVar5 | (uint)(iVar37 >= (int)uVar5) * iVar37;
  uVar113 = (iVar43 < (int)uVar5) * uVar5 | (uint)(iVar43 >= (int)uVar5) * iVar43;
  uVar117 = (iVar45 < (int)uVar5) * uVar5 | (uint)(iVar45 >= (int)uVar5) * iVar45;
  uVar121 = (iVar47 < (int)uVar5) * uVar5 | (uint)(iVar47 >= (int)uVar5) * iVar47;
  auVar41._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar41._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar41._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar41._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar105 = (iVar143 < (int)uVar5) * uVar5 | (uint)(iVar143 >= (int)uVar5) * iVar143;
  uVar113 = (iVar149 < (int)uVar5) * uVar5 | (uint)(iVar149 >= (int)uVar5) * iVar149;
  uVar117 = (iVar151 < (int)uVar5) * uVar5 | (uint)(iVar151 >= (int)uVar5) * iVar151;
  uVar121 = (iVar153 < (int)uVar5) * uVar5 | (uint)(iVar153 >= (int)uVar5) * iVar153;
  auVar145._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar145._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar145._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar145._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  auVar10 = pmulld(auVar18,auVar145);
  auVar96 = pmulld(auVar145,auVar158);
  auVar179 = pmulld(auVar158,auVar41);
  auVar39 = pmulld(auVar41,auVar18);
  auVar133._4_4_ = iVar9;
  auVar133._0_4_ = iVar9;
  auVar133._8_4_ = iVar9;
  auVar133._12_4_ = iVar9;
  uVar105 = (iVar79 < (int)uVar5) * uVar5 | (uint)(iVar79 >= (int)uVar5) * iVar79;
  uVar113 = (iVar83 < (int)uVar5) * uVar5 | (uint)(iVar83 >= (int)uVar5) * iVar83;
  uVar117 = (iVar85 < (int)uVar5) * uVar5 | (uint)(iVar85 >= (int)uVar5) * iVar85;
  uVar121 = (iVar87 < (int)uVar5) * uVar5 | (uint)(iVar87 >= (int)uVar5) * iVar87;
  auVar82._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar82._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar82._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar82._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar105 = (iVar131 < (int)uVar5) * uVar5 | (uint)(iVar131 >= (int)uVar5) * iVar131;
  uVar113 = (iVar137 < (int)uVar5) * uVar5 | (uint)(iVar137 >= (int)uVar5) * iVar137;
  uVar117 = (iVar139 < (int)uVar5) * uVar5 | (uint)(iVar139 >= (int)uVar5) * iVar139;
  uVar121 = (iVar141 < (int)uVar5) * uVar5 | (uint)(iVar141 >= (int)uVar5) * iVar141;
  auVar134._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar134._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar134._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar134._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  auVar108 = pmulld(auVar134,auVar181);
  auVar182 = pmulld(auVar181,auVar82);
  auVar55 = pmulld(auVar82,auVar133);
  auVar81 = pmulld(auVar134,auVar133);
  auVar12._4_4_ = iVar7;
  auVar12._0_4_ = iVar7;
  auVar12._8_4_ = iVar7;
  auVar12._12_4_ = iVar7;
  uVar105 = (iVar52 < (int)uVar5) * uVar5 | (uint)(iVar52 >= (int)uVar5) * iVar52;
  uVar113 = (iVar62 < (int)uVar5) * uVar5 | (uint)(iVar62 >= (int)uVar5) * iVar62;
  uVar117 = (iVar68 < (int)uVar5) * uVar5 | (uint)(iVar68 >= (int)uVar5) * iVar68;
  uVar121 = (iVar74 < (int)uVar5) * uVar5 | (uint)(iVar74 >= (int)uVar5) * iVar74;
  auVar146._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar146._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar146._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar146._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar105 = (iVar91 < (int)uVar5) * uVar5 | (uint)(iVar91 >= (int)uVar5) * iVar91;
  uVar113 = (iVar92 < (int)uVar5) * uVar5 | (uint)(iVar92 >= (int)uVar5) * iVar92;
  uVar117 = (iVar93 < (int)uVar5) * uVar5 | (uint)(iVar93 >= (int)uVar5) * iVar93;
  uVar121 = (iVar75 < (int)uVar5) * uVar5 | (uint)(iVar75 >= (int)uVar5) * iVar75;
  auVar56._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar56._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar56._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar56._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  auVar89 = pmulld(auVar56,auVar18);
  auVar17 = pmulld(auVar18,auVar146);
  auVar125 = pmulld(auVar146,auVar12);
  auVar40 = pmulld(auVar56,auVar12);
  uVar105 = (iVar49 < (int)uVar5) * uVar5 | (uint)(iVar49 >= (int)uVar5) * iVar49;
  uVar113 = (iVar59 < (int)uVar5) * uVar5 | (uint)(iVar59 >= (int)uVar5) * iVar59;
  uVar117 = (iVar65 < (int)uVar5) * uVar5 | (uint)(iVar65 >= (int)uVar5) * iVar65;
  uVar121 = (iVar71 < (int)uVar5) * uVar5 | (uint)(iVar71 >= (int)uVar5) * iVar71;
  uVar53 = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  uVar63 = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  uVar69 = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  uVar76 = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar105 = (iVar15 < (int)uVar5) * uVar5 | (uint)(iVar15 >= (int)uVar5) * iVar15;
  uVar113 = (iVar22 < (int)uVar5) * uVar5 | (uint)(iVar22 >= (int)uVar5) * iVar22;
  uVar117 = (iVar26 < (int)uVar5) * uVar5 | (uint)(iVar26 >= (int)uVar5) * iVar26;
  uVar121 = (iVar30 < (int)uVar5) * uVar5 | (uint)(iVar30 >= (int)uVar5) * iVar30;
  uVar105 = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  uVar113 = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  uVar117 = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  uVar121 = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  iVar167 = uVar105 + uVar53;
  iVar93 = uVar113 + uVar63;
  iVar22 = uVar117 + uVar69;
  iVar30 = uVar121 + uVar76;
  iVar65 = uVar53 - uVar105;
  iVar68 = uVar63 - uVar113;
  iVar71 = uVar69 - uVar117;
  iVar74 = uVar76 - uVar121;
  uVar105 = (iVar50 < (int)uVar5) * uVar5 | (uint)(iVar50 >= (int)uVar5) * iVar50;
  uVar113 = (iVar60 < (int)uVar5) * uVar5 | (uint)(iVar60 >= (int)uVar5) * iVar60;
  uVar117 = (iVar66 < (int)uVar5) * uVar5 | (uint)(iVar66 >= (int)uVar5) * iVar66;
  uVar121 = (iVar72 < (int)uVar5) * uVar5 | (uint)(iVar72 >= (int)uVar5) * iVar72;
  uVar53 = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  uVar63 = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  uVar69 = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  uVar76 = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar105 = (iVar51 < (int)uVar5) * uVar5 | (uint)(iVar51 >= (int)uVar5) * iVar51;
  uVar113 = (iVar61 < (int)uVar5) * uVar5 | (uint)(iVar61 >= (int)uVar5) * iVar61;
  uVar117 = (iVar67 < (int)uVar5) * uVar5 | (uint)(iVar67 >= (int)uVar5) * iVar67;
  uVar121 = (iVar73 < (int)uVar5) * uVar5 | (uint)(iVar73 >= (int)uVar5) * iVar73;
  uVar105 = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  uVar113 = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  uVar117 = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  uVar121 = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  iVar171 = uVar105 + uVar53;
  iVar15 = uVar113 + uVar63;
  iVar26 = uVar117 + uVar69;
  iVar37 = uVar121 + uVar76;
  iVar104 = uVar53 - uVar105;
  iVar112 = uVar63 - uVar113;
  iVar116 = uVar69 - uVar117;
  iVar120 = uVar76 - uVar121;
  uVar105 = (iVar13 < (int)uVar5) * uVar5 | (uint)(iVar13 >= (int)uVar5) * iVar13;
  uVar113 = (iVar20 < (int)uVar5) * uVar5 | (uint)(iVar20 >= (int)uVar5) * iVar20;
  uVar117 = (iVar24 < (int)uVar5) * uVar5 | (uint)(iVar24 >= (int)uVar5) * iVar24;
  uVar121 = (iVar28 < (int)uVar5) * uVar5 | (uint)(iVar28 >= (int)uVar5) * iVar28;
  uVar53 = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  uVar63 = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  uVar69 = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  uVar76 = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar105 = (iVar16 < (int)uVar5) * uVar5 | (uint)(iVar16 >= (int)uVar5) * iVar16;
  uVar113 = (iVar23 < (int)uVar5) * uVar5 | (uint)(iVar23 >= (int)uVar5) * iVar23;
  uVar117 = (iVar27 < (int)uVar5) * uVar5 | (uint)(iVar27 >= (int)uVar5) * iVar27;
  uVar121 = (iVar31 < (int)uVar5) * uVar5 | (uint)(iVar31 >= (int)uVar5) * iVar31;
  uVar105 = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  uVar113 = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  uVar117 = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  uVar121 = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  iVar7 = uVar105 + uVar53;
  iVar13 = uVar113 + uVar63;
  iVar23 = uVar117 + uVar69;
  iVar31 = uVar121 + uVar76;
  iVar59 = uVar53 - uVar105;
  iVar60 = uVar63 - uVar113;
  iVar61 = uVar69 - uVar117;
  iVar62 = uVar76 - uVar121;
  uVar105 = (iVar14 < (int)uVar5) * uVar5 | (uint)(iVar14 >= (int)uVar5) * iVar14;
  uVar113 = (iVar21 < (int)uVar5) * uVar5 | (uint)(iVar21 >= (int)uVar5) * iVar21;
  uVar117 = (iVar25 < (int)uVar5) * uVar5 | (uint)(iVar25 >= (int)uVar5) * iVar25;
  uVar121 = (iVar29 < (int)uVar5) * uVar5 | (uint)(iVar29 >= (int)uVar5) * iVar29;
  uVar105 = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  uVar113 = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  uVar117 = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  uVar121 = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar53 = (iVar94 < (int)uVar5) * uVar5 | (uint)(iVar94 >= (int)uVar5) * iVar94;
  uVar63 = (iVar98 < (int)uVar5) * uVar5 | (uint)(iVar98 >= (int)uVar5) * iVar98;
  uVar69 = (iVar100 < (int)uVar5) * uVar5 | (uint)(iVar100 >= (int)uVar5) * iVar100;
  uVar76 = (iVar102 < (int)uVar5) * uVar5 | (uint)(iVar102 >= (int)uVar5) * iVar102;
  uVar53 = (uint)(iVar175 < (int)uVar53) * iVar175 | (iVar175 >= (int)uVar53) * uVar53;
  uVar63 = (uint)(iVar175 < (int)uVar63) * iVar175 | (iVar175 >= (int)uVar63) * uVar63;
  uVar69 = (uint)(iVar175 < (int)uVar69) * iVar175 | (iVar175 >= (int)uVar69) * uVar69;
  uVar76 = (uint)(iVar175 < (int)uVar76) * iVar175 | (iVar175 >= (int)uVar76) * uVar76;
  iVar87 = auVar78._0_4_ + iVar6 + auVar11._0_4_ >> auVar126;
  iVar94 = auVar78._4_4_ + iVar6 + auVar11._4_4_ >> auVar126;
  iVar98 = auVar78._8_4_ + iVar6 + auVar11._8_4_ >> auVar126;
  iVar100 = auVar78._12_4_ + iVar6 + auVar11._12_4_ >> auVar126;
  iVar91 = auVar55._0_4_ + iVar6 + auVar108._0_4_ >> auVar126;
  iVar92 = auVar55._4_4_ + iVar6 + auVar108._4_4_ >> auVar126;
  iVar20 = auVar55._8_4_ + iVar6 + auVar108._8_4_ >> auVar126;
  iVar21 = auVar55._12_4_ + iVar6 + auVar108._12_4_ >> auVar126;
  iVar8 = uVar53 + uVar105;
  iVar14 = uVar63 + uVar113;
  iVar24 = uVar69 + uVar117;
  iVar29 = uVar76 + uVar121;
  iVar102 = uVar105 - uVar53;
  iVar131 = uVar113 - uVar63;
  iVar137 = uVar117 - uVar69;
  iVar139 = uVar121 - uVar76;
  iVar9 = iVar91 + iVar87;
  iVar16 = iVar92 + iVar94;
  iVar25 = iVar20 + iVar98;
  iVar43 = iVar21 + iVar100;
  iVar87 = iVar87 - iVar91;
  iVar94 = iVar94 - iVar92;
  iVar98 = iVar98 - iVar20;
  iVar100 = iVar100 - iVar21;
  iVar153 = (auVar180._0_4_ + iVar6) - auVar169._0_4_ >> auVar126;
  iVar155 = (auVar180._4_4_ + iVar6) - auVar169._4_4_ >> auVar126;
  iVar161 = (auVar180._8_4_ + iVar6) - auVar169._8_4_ >> auVar126;
  iVar163 = (auVar180._12_4_ + iVar6) - auVar169._12_4_ >> auVar126;
  iVar91 = auVar39._0_4_ + iVar6 + auVar96._0_4_ >> auVar126;
  iVar20 = auVar39._4_4_ + iVar6 + auVar96._4_4_ >> auVar126;
  iVar27 = auVar39._8_4_ + iVar6 + auVar96._8_4_ >> auVar126;
  iVar45 = auVar39._12_4_ + iVar6 + auVar96._12_4_ >> auVar126;
  iVar92 = (auVar182._0_4_ + iVar6) - auVar81._0_4_ >> auVar126;
  iVar21 = (auVar182._4_4_ + iVar6) - auVar81._4_4_ >> auVar126;
  iVar28 = (auVar182._8_4_ + iVar6) - auVar81._8_4_ >> auVar126;
  iVar47 = (auVar182._12_4_ + iVar6) - auVar81._12_4_ >> auVar126;
  iVar66 = iVar92 + iVar153;
  iVar72 = iVar21 + iVar155;
  iVar75 = iVar28 + iVar161;
  iVar83 = iVar47 + iVar163;
  iVar153 = iVar153 - iVar92;
  iVar155 = iVar155 - iVar21;
  iVar161 = iVar161 - iVar28;
  iVar163 = iVar163 - iVar47;
  iVar92 = auVar125._0_4_ + iVar6 + auVar89._0_4_ >> auVar126;
  iVar21 = auVar125._4_4_ + iVar6 + auVar89._4_4_ >> auVar126;
  iVar28 = auVar125._8_4_ + iVar6 + auVar89._8_4_ >> auVar126;
  iVar47 = auVar125._12_4_ + iVar6 + auVar89._12_4_ >> auVar126;
  iVar67 = iVar92 + iVar91;
  iVar73 = iVar21 + iVar20;
  iVar79 = iVar28 + iVar27;
  iVar85 = iVar47 + iVar45;
  iVar91 = iVar91 - iVar92;
  iVar20 = iVar20 - iVar21;
  iVar27 = iVar27 - iVar28;
  iVar45 = iVar45 - iVar47;
  iVar141 = (auVar179._0_4_ + iVar6) - auVar10._0_4_ >> auVar126;
  iVar143 = (auVar179._4_4_ + iVar6) - auVar10._4_4_ >> auVar126;
  iVar149 = (auVar179._8_4_ + iVar6) - auVar10._8_4_ >> auVar126;
  iVar151 = (auVar179._12_4_ + iVar6) - auVar10._12_4_ >> auVar126;
  iVar49 = (auVar17._0_4_ + iVar6) - auVar40._0_4_ >> auVar126;
  iVar50 = (auVar17._4_4_ + iVar6) - auVar40._4_4_ >> auVar126;
  iVar51 = (auVar17._8_4_ + iVar6) - auVar40._8_4_ >> auVar126;
  iVar52 = (auVar17._12_4_ + iVar6) - auVar40._12_4_ >> auVar126;
  iVar92 = iVar49 + iVar141;
  iVar21 = iVar50 + iVar143;
  iVar28 = iVar51 + iVar149;
  iVar47 = iVar52 + iVar151;
  iVar141 = iVar141 - iVar49;
  iVar143 = iVar143 - iVar50;
  iVar149 = iVar149 - iVar51;
  iVar151 = iVar151 - iVar52;
  auVar183._4_4_ = iVar173;
  auVar183._0_4_ = iVar173;
  auVar183._8_4_ = iVar173;
  auVar183._12_4_ = iVar173;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1a0);
  auVar147._4_4_ = uVar1;
  auVar147._0_4_ = uVar1;
  auVar147._8_4_ = uVar1;
  auVar147._12_4_ = uVar1;
  uVar105 = (iVar65 < (int)uVar5) * uVar5 | (uint)(iVar65 >= (int)uVar5) * iVar65;
  uVar113 = (iVar68 < (int)uVar5) * uVar5 | (uint)(iVar68 >= (int)uVar5) * iVar68;
  uVar117 = (iVar71 < (int)uVar5) * uVar5 | (uint)(iVar71 >= (int)uVar5) * iVar71;
  uVar121 = (iVar74 < (int)uVar5) * uVar5 | (uint)(iVar74 >= (int)uVar5) * iVar74;
  auVar57._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar57._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar57._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar57._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar105 = (iVar104 < (int)uVar5) * uVar5 | (uint)(iVar104 >= (int)uVar5) * iVar104;
  uVar113 = (iVar112 < (int)uVar5) * uVar5 | (uint)(iVar112 >= (int)uVar5) * iVar112;
  uVar117 = (iVar116 < (int)uVar5) * uVar5 | (uint)(iVar116 >= (int)uVar5) * iVar116;
  uVar121 = (iVar120 < (int)uVar5) * uVar5 | (uint)(iVar120 >= (int)uVar5) * iVar120;
  auVar19._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar19._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar19._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar19._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  auVar11 = pmulld(auVar147,auVar19);
  auVar10 = pmulld(auVar19,auVar183);
  auVar81 = pmulld(auVar57,auVar147);
  auVar55 = pmulld(auVar57,auVar183);
  auVar135._4_4_ = iVar4;
  auVar135._0_4_ = iVar4;
  auVar135._8_4_ = iVar4;
  auVar135._12_4_ = iVar4;
  uVar105 = (iVar59 < (int)uVar5) * uVar5 | (uint)(iVar59 >= (int)uVar5) * iVar59;
  uVar113 = (iVar60 < (int)uVar5) * uVar5 | (uint)(iVar60 >= (int)uVar5) * iVar60;
  uVar117 = (iVar61 < (int)uVar5) * uVar5 | (uint)(iVar61 >= (int)uVar5) * iVar61;
  uVar121 = (iVar62 < (int)uVar5) * uVar5 | (uint)(iVar62 >= (int)uVar5) * iVar62;
  auVar42._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar42._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar42._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar42._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar105 = (iVar102 < (int)uVar5) * uVar5 | (uint)(iVar102 >= (int)uVar5) * iVar102;
  uVar113 = (iVar131 < (int)uVar5) * uVar5 | (uint)(iVar131 >= (int)uVar5) * iVar131;
  uVar117 = (iVar137 < (int)uVar5) * uVar5 | (uint)(iVar137 >= (int)uVar5) * iVar137;
  uVar121 = (iVar139 < (int)uVar5) * uVar5 | (uint)(iVar139 >= (int)uVar5) * iVar139;
  auVar97._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar97._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar97._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar97._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  auVar17 = pmulld(auVar135,auVar97);
  auVar96 = pmulld(auVar97,auVar147);
  auVar78 = pmulld(auVar42,auVar135);
  auVar89 = pmulld(auVar42,auVar147);
  uVar105 = (iVar87 < (int)uVar5) * uVar5 | (uint)(iVar87 >= (int)uVar5) * iVar87;
  uVar113 = (iVar94 < (int)uVar5) * uVar5 | (uint)(iVar94 >= (int)uVar5) * iVar94;
  uVar117 = (iVar98 < (int)uVar5) * uVar5 | (uint)(iVar98 >= (int)uVar5) * iVar98;
  uVar121 = (iVar100 < (int)uVar5) * uVar5 | (uint)(iVar100 >= (int)uVar5) * iVar100;
  auVar110._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar110._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar110._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar110._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar105 = (iVar153 < (int)uVar5) * uVar5 | (uint)(iVar153 >= (int)uVar5) * iVar153;
  uVar113 = (iVar155 < (int)uVar5) * uVar5 | (uint)(iVar155 >= (int)uVar5) * iVar155;
  uVar117 = (iVar161 < (int)uVar5) * uVar5 | (uint)(iVar161 >= (int)uVar5) * iVar161;
  uVar121 = (iVar163 < (int)uVar5) * uVar5 | (uint)(iVar163 >= (int)uVar5) * iVar163;
  auVar170._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar170._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar170._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar170._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  auVar39 = pmulld(auVar147,auVar170);
  auVar180 = pmulld(auVar170,auVar183);
  auVar108 = pmulld(auVar183,auVar110);
  auVar125 = pmulld(auVar110,auVar147);
  uVar105 = (iVar91 < (int)uVar5) * uVar5 | (uint)(iVar91 >= (int)uVar5) * iVar91;
  uVar113 = (iVar20 < (int)uVar5) * uVar5 | (uint)(iVar20 >= (int)uVar5) * iVar20;
  uVar117 = (iVar27 < (int)uVar5) * uVar5 | (uint)(iVar27 >= (int)uVar5) * iVar27;
  uVar121 = (iVar45 < (int)uVar5) * uVar5 | (uint)(iVar45 >= (int)uVar5) * iVar45;
  auVar127._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar127._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar127._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar127._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar105 = (iVar141 < (int)uVar5) * uVar5 | (uint)(iVar141 >= (int)uVar5) * iVar141;
  uVar113 = (iVar143 < (int)uVar5) * uVar5 | (uint)(iVar143 >= (int)uVar5) * iVar143;
  uVar117 = (iVar149 < (int)uVar5) * uVar5 | (uint)(iVar149 >= (int)uVar5) * iVar149;
  uVar121 = (iVar151 < (int)uVar5) * uVar5 | (uint)(iVar151 >= (int)uVar5) * iVar151;
  auVar159._0_4_ = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  auVar159._4_4_ = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  auVar159._8_4_ = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  auVar159._12_4_ = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  auVar40 = pmulld(auVar159,auVar147);
  auVar169 = pmulld(auVar147,auVar127);
  auVar133 = pmulld(auVar127,auVar135);
  auVar179 = pmulld(auVar159,auVar135);
  uVar105 = (iVar167 < (int)uVar5) * uVar5 | (uint)(iVar167 >= (int)uVar5) * iVar167;
  uVar113 = (iVar93 < (int)uVar5) * uVar5 | (uint)(iVar93 >= (int)uVar5) * iVar93;
  uVar117 = (iVar22 < (int)uVar5) * uVar5 | (uint)(iVar22 >= (int)uVar5) * iVar22;
  uVar121 = (iVar30 < (int)uVar5) * uVar5 | (uint)(iVar30 >= (int)uVar5) * iVar30;
  uVar53 = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  uVar63 = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  uVar69 = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  uVar76 = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar105 = (iVar7 < (int)uVar5) * uVar5 | (uint)(iVar7 >= (int)uVar5) * iVar7;
  uVar113 = (iVar13 < (int)uVar5) * uVar5 | (uint)(iVar13 >= (int)uVar5) * iVar13;
  uVar117 = (iVar23 < (int)uVar5) * uVar5 | (uint)(iVar23 >= (int)uVar5) * iVar23;
  uVar121 = (iVar31 < (int)uVar5) * uVar5 | (uint)(iVar31 >= (int)uVar5) * iVar31;
  uVar105 = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  uVar113 = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  uVar117 = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  uVar121 = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  iVar20 = uVar105 + uVar53;
  iVar23 = uVar113 + uVar63;
  iVar27 = uVar117 + uVar69;
  iVar30 = uVar121 + uVar76;
  iVar61 = uVar53 - uVar105;
  iVar65 = uVar63 - uVar113;
  iVar68 = uVar69 - uVar117;
  iVar71 = uVar76 - uVar121;
  uVar105 = (iVar171 < (int)uVar5) * uVar5 | (uint)(iVar171 >= (int)uVar5) * iVar171;
  uVar113 = (iVar15 < (int)uVar5) * uVar5 | (uint)(iVar15 >= (int)uVar5) * iVar15;
  uVar117 = (iVar26 < (int)uVar5) * uVar5 | (uint)(iVar26 >= (int)uVar5) * iVar26;
  uVar121 = (iVar37 < (int)uVar5) * uVar5 | (uint)(iVar37 >= (int)uVar5) * iVar37;
  uVar53 = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  uVar63 = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  uVar69 = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  uVar76 = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar105 = (iVar8 < (int)uVar5) * uVar5 | (uint)(iVar8 >= (int)uVar5) * iVar8;
  uVar113 = (iVar14 < (int)uVar5) * uVar5 | (uint)(iVar14 >= (int)uVar5) * iVar14;
  uVar117 = (iVar24 < (int)uVar5) * uVar5 | (uint)(iVar24 >= (int)uVar5) * iVar24;
  uVar121 = (iVar29 < (int)uVar5) * uVar5 | (uint)(iVar29 >= (int)uVar5) * iVar29;
  uVar105 = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  uVar113 = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  uVar117 = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  uVar121 = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  iVar50 = auVar81._0_4_ + iVar6 + auVar10._0_4_ >> auVar126;
  iVar51 = auVar81._4_4_ + iVar6 + auVar10._4_4_ >> auVar126;
  iVar52 = auVar81._8_4_ + iVar6 + auVar10._8_4_ >> auVar126;
  iVar59 = auVar81._12_4_ + iVar6 + auVar10._12_4_ >> auVar126;
  iVar22 = uVar105 + uVar53;
  iVar24 = uVar113 + uVar63;
  iVar26 = uVar117 + uVar69;
  iVar29 = uVar121 + uVar76;
  iVar87 = uVar53 - uVar105;
  iVar94 = uVar63 - uVar113;
  iVar98 = uVar69 - uVar117;
  iVar100 = uVar76 - uVar121;
  iVar171 = auVar78._0_4_ + iVar6 + auVar96._0_4_ >> auVar126;
  iVar173 = auVar78._4_4_ + iVar6 + auVar96._4_4_ >> auVar126;
  iVar7 = auVar78._8_4_ + iVar6 + auVar96._8_4_ >> auVar126;
  iVar8 = auVar78._12_4_ + iVar6 + auVar96._12_4_ >> auVar126;
  iVar167 = iVar171 + iVar50;
  iVar4 = iVar173 + iVar51;
  iVar91 = iVar7 + iVar52;
  iVar13 = iVar8 + iVar59;
  iVar50 = iVar50 - iVar171;
  iVar51 = iVar51 - iVar173;
  iVar52 = iVar52 - iVar7;
  iVar59 = iVar59 - iVar8;
  iVar31 = (auVar55._0_4_ + iVar6) - auVar11._0_4_ >> auVar126;
  iVar37 = (auVar55._4_4_ + iVar6) - auVar11._4_4_ >> auVar126;
  iVar45 = (auVar55._8_4_ + iVar6) - auVar11._8_4_ >> auVar126;
  iVar49 = (auVar55._12_4_ + iVar6) - auVar11._12_4_ >> auVar126;
  iVar173 = (auVar89._0_4_ + iVar6) - auVar17._0_4_ >> auVar126;
  iVar8 = (auVar89._4_4_ + iVar6) - auVar17._4_4_ >> auVar126;
  iVar15 = (auVar89._8_4_ + iVar6) - auVar17._8_4_ >> auVar126;
  iVar60 = (auVar89._12_4_ + iVar6) - auVar17._12_4_ >> auVar126;
  iVar171 = iVar173 + iVar31;
  iVar7 = iVar8 + iVar37;
  iVar93 = iVar15 + iVar45;
  iVar14 = iVar60 + iVar49;
  iVar31 = iVar31 - iVar173;
  iVar37 = iVar37 - iVar8;
  iVar45 = iVar45 - iVar15;
  iVar49 = iVar49 - iVar60;
  uVar105 = (iVar9 < (int)uVar5) * uVar5 | (uint)(iVar9 >= (int)uVar5) * iVar9;
  uVar113 = (iVar16 < (int)uVar5) * uVar5 | (uint)(iVar16 >= (int)uVar5) * iVar16;
  uVar117 = (iVar25 < (int)uVar5) * uVar5 | (uint)(iVar25 >= (int)uVar5) * iVar25;
  uVar121 = (iVar43 < (int)uVar5) * uVar5 | (uint)(iVar43 >= (int)uVar5) * iVar43;
  uVar53 = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  uVar63 = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  uVar69 = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  uVar76 = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar105 = (iVar67 < (int)uVar5) * uVar5 | (uint)(iVar67 >= (int)uVar5) * iVar67;
  uVar113 = (iVar73 < (int)uVar5) * uVar5 | (uint)(iVar73 >= (int)uVar5) * iVar73;
  uVar117 = (iVar79 < (int)uVar5) * uVar5 | (uint)(iVar79 >= (int)uVar5) * iVar79;
  uVar121 = (iVar85 < (int)uVar5) * uVar5 | (uint)(iVar85 >= (int)uVar5) * iVar85;
  uVar105 = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  uVar113 = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  uVar117 = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  uVar121 = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  iVar137 = uVar105 + uVar53;
  iVar139 = uVar113 + uVar63;
  iVar141 = uVar117 + uVar69;
  iVar143 = uVar121 + uVar76;
  iVar173 = uVar53 - uVar105;
  iVar8 = uVar63 - uVar113;
  iVar9 = uVar69 - uVar117;
  iVar15 = uVar76 - uVar121;
  uVar105 = (iVar66 < (int)uVar5) * uVar5 | (uint)(iVar66 >= (int)uVar5) * iVar66;
  uVar113 = (iVar72 < (int)uVar5) * uVar5 | (uint)(iVar72 >= (int)uVar5) * iVar72;
  uVar117 = (iVar75 < (int)uVar5) * uVar5 | (uint)(iVar75 >= (int)uVar5) * iVar75;
  uVar121 = (iVar83 < (int)uVar5) * uVar5 | (uint)(iVar83 >= (int)uVar5) * iVar83;
  uVar53 = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  uVar63 = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  uVar69 = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  uVar76 = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  uVar105 = (iVar92 < (int)uVar5) * uVar5 | (uint)(iVar92 >= (int)uVar5) * iVar92;
  uVar113 = (iVar21 < (int)uVar5) * uVar5 | (uint)(iVar21 >= (int)uVar5) * iVar21;
  uVar117 = (iVar28 < (int)uVar5) * uVar5 | (uint)(iVar28 >= (int)uVar5) * iVar28;
  uVar121 = (iVar47 < (int)uVar5) * uVar5 | (uint)(iVar47 >= (int)uVar5) * iVar47;
  uVar105 = (uint)(iVar175 < (int)uVar105) * iVar175 | (iVar175 >= (int)uVar105) * uVar105;
  uVar113 = (uint)(iVar175 < (int)uVar113) * iVar175 | (iVar175 >= (int)uVar113) * uVar113;
  uVar117 = (uint)(iVar175 < (int)uVar117) * iVar175 | (iVar175 >= (int)uVar117) * uVar117;
  uVar121 = (uint)(iVar175 < (int)uVar121) * iVar175 | (iVar175 >= (int)uVar121) * uVar121;
  iVar149 = auVar125._0_4_ + iVar6 + auVar180._0_4_ >> auVar126;
  iVar151 = auVar125._4_4_ + iVar6 + auVar180._4_4_ >> auVar126;
  iVar153 = auVar125._8_4_ + iVar6 + auVar180._8_4_ >> auVar126;
  iVar155 = auVar125._12_4_ + iVar6 + auVar180._12_4_ >> auVar126;
  iVar28 = uVar105 + uVar53;
  iVar43 = uVar113 + uVar63;
  iVar47 = uVar117 + uVar69;
  iVar60 = uVar121 + uVar76;
  iVar112 = uVar53 - uVar105;
  iVar116 = uVar63 - uVar113;
  iVar120 = uVar69 - uVar117;
  iVar131 = uVar76 - uVar121;
  iVar92 = auVar133._0_4_ + iVar6 + auVar40._0_4_ >> auVar126;
  iVar16 = auVar133._4_4_ + iVar6 + auVar40._4_4_ >> auVar126;
  iVar21 = auVar133._8_4_ + iVar6 + auVar40._8_4_ >> auVar126;
  iVar25 = auVar133._12_4_ + iVar6 + auVar40._12_4_ >> auVar126;
  iVar73 = iVar92 + iVar149;
  iVar74 = iVar16 + iVar151;
  iVar75 = iVar21 + iVar153;
  iVar79 = iVar25 + iVar155;
  iVar149 = iVar149 - iVar92;
  iVar151 = iVar151 - iVar16;
  iVar153 = iVar153 - iVar21;
  iVar155 = iVar155 - iVar25;
  iVar92 = (auVar108._0_4_ + iVar6) - auVar39._0_4_ >> auVar126;
  iVar16 = (auVar108._4_4_ + iVar6) - auVar39._4_4_ >> auVar126;
  iVar21 = (auVar108._8_4_ + iVar6) - auVar39._8_4_ >> auVar126;
  iVar25 = (auVar108._12_4_ + iVar6) - auVar39._12_4_ >> auVar126;
  iVar83 = (auVar169._0_4_ + iVar6) - auVar179._0_4_ >> auVar126;
  iVar85 = (auVar169._4_4_ + iVar6) - auVar179._4_4_ >> auVar126;
  iVar102 = (auVar169._8_4_ + iVar6) - auVar179._8_4_ >> auVar126;
  iVar104 = (auVar169._12_4_ + iVar6) - auVar179._12_4_ >> auVar126;
  iVar62 = iVar83 + iVar92;
  iVar66 = iVar85 + iVar16;
  iVar67 = iVar102 + iVar21;
  iVar72 = iVar104 + iVar25;
  iVar92 = iVar92 - iVar83;
  iVar16 = iVar16 - iVar85;
  iVar21 = iVar21 - iVar102;
  iVar25 = iVar25 - iVar104;
  uVar53 = (iVar20 < (int)uVar5) * uVar5 | (uint)(iVar20 >= (int)uVar5) * iVar20;
  uVar63 = (iVar23 < (int)uVar5) * uVar5 | (uint)(iVar23 >= (int)uVar5) * iVar23;
  uVar69 = (iVar27 < (int)uVar5) * uVar5 | (uint)(iVar27 >= (int)uVar5) * iVar27;
  uVar76 = (iVar30 < (int)uVar5) * uVar5 | (uint)(iVar30 >= (int)uVar5) * iVar30;
  uVar132 = (iVar61 < (int)uVar5) * uVar5 | (uint)(iVar61 >= (int)uVar5) * iVar61;
  uVar138 = (iVar65 < (int)uVar5) * uVar5 | (uint)(iVar65 >= (int)uVar5) * iVar65;
  uVar140 = (iVar68 < (int)uVar5) * uVar5 | (uint)(iVar68 >= (int)uVar5) * iVar68;
  uVar142 = (iVar71 < (int)uVar5) * uVar5 | (uint)(iVar71 >= (int)uVar5) * iVar71;
  uVar32 = (iVar22 < (int)uVar5) * uVar5 | (uint)(iVar22 >= (int)uVar5) * iVar22;
  uVar34 = (iVar24 < (int)uVar5) * uVar5 | (uint)(iVar24 >= (int)uVar5) * iVar24;
  uVar35 = (iVar26 < (int)uVar5) * uVar5 | (uint)(iVar26 >= (int)uVar5) * iVar26;
  uVar36 = (iVar29 < (int)uVar5) * uVar5 | (uint)(iVar29 >= (int)uVar5) * iVar29;
  uVar106 = (iVar87 < (int)uVar5) * uVar5 | (uint)(iVar87 >= (int)uVar5) * iVar87;
  uVar114 = (iVar94 < (int)uVar5) * uVar5 | (uint)(iVar94 >= (int)uVar5) * iVar94;
  uVar118 = (iVar98 < (int)uVar5) * uVar5 | (uint)(iVar98 >= (int)uVar5) * iVar98;
  uVar122 = (iVar100 < (int)uVar5) * uVar5 | (uint)(iVar100 >= (int)uVar5) * iVar100;
  uVar38 = (iVar167 < (int)uVar5) * uVar5 | (uint)(iVar167 >= (int)uVar5) * iVar167;
  uVar44 = (iVar4 < (int)uVar5) * uVar5 | (uint)(iVar4 >= (int)uVar5) * iVar4;
  uVar46 = (iVar91 < (int)uVar5) * uVar5 | (uint)(iVar91 >= (int)uVar5) * iVar91;
  uVar48 = (iVar13 < (int)uVar5) * uVar5 | (uint)(iVar13 >= (int)uVar5) * iVar13;
  uVar144 = (iVar50 < (int)uVar5) * uVar5 | (uint)(iVar50 >= (int)uVar5) * iVar50;
  uVar150 = (iVar51 < (int)uVar5) * uVar5 | (uint)(iVar51 >= (int)uVar5) * iVar51;
  uVar152 = (iVar52 < (int)uVar5) * uVar5 | (uint)(iVar52 >= (int)uVar5) * iVar52;
  uVar154 = (iVar59 < (int)uVar5) * uVar5 | (uint)(iVar59 >= (int)uVar5) * iVar59;
  uVar105 = (iVar171 < (int)uVar5) * uVar5 | (uint)(iVar171 >= (int)uVar5) * iVar171;
  uVar113 = (iVar7 < (int)uVar5) * uVar5 | (uint)(iVar7 >= (int)uVar5) * iVar7;
  uVar117 = (iVar93 < (int)uVar5) * uVar5 | (uint)(iVar93 >= (int)uVar5) * iVar93;
  uVar121 = (iVar14 < (int)uVar5) * uVar5 | (uint)(iVar14 >= (int)uVar5) * iVar14;
  uVar107 = (iVar31 < (int)uVar5) * uVar5 | (uint)(iVar31 >= (int)uVar5) * iVar31;
  uVar115 = (iVar37 < (int)uVar5) * uVar5 | (uint)(iVar37 >= (int)uVar5) * iVar37;
  uVar119 = (iVar45 < (int)uVar5) * uVar5 | (uint)(iVar45 >= (int)uVar5) * iVar45;
  uVar123 = (iVar49 < (int)uVar5) * uVar5 | (uint)(iVar49 >= (int)uVar5) * iVar49;
  uVar168 = (iVar137 < (int)uVar5) * uVar5 | (uint)(iVar137 >= (int)uVar5) * iVar137;
  uVar172 = (iVar139 < (int)uVar5) * uVar5 | (uint)(iVar139 >= (int)uVar5) * iVar139;
  uVar174 = (iVar141 < (int)uVar5) * uVar5 | (uint)(iVar141 >= (int)uVar5) * iVar141;
  uVar176 = (iVar143 < (int)uVar5) * uVar5 | (uint)(iVar143 >= (int)uVar5) * iVar143;
  uVar177 = (iVar173 < (int)uVar5) * uVar5 | (uint)(iVar173 >= (int)uVar5) * iVar173;
  uVar187 = (iVar8 < (int)uVar5) * uVar5 | (uint)(iVar8 >= (int)uVar5) * iVar8;
  uVar190 = (iVar9 < (int)uVar5) * uVar5 | (uint)(iVar9 >= (int)uVar5) * iVar9;
  uVar193 = (iVar15 < (int)uVar5) * uVar5 | (uint)(iVar15 >= (int)uVar5) * iVar15;
  uVar80 = (iVar28 < (int)uVar5) * uVar5 | (uint)(iVar28 >= (int)uVar5) * iVar28;
  uVar84 = (iVar43 < (int)uVar5) * uVar5 | (uint)(iVar43 >= (int)uVar5) * iVar43;
  uVar86 = (iVar47 < (int)uVar5) * uVar5 | (uint)(iVar47 >= (int)uVar5) * iVar47;
  uVar88 = (iVar60 < (int)uVar5) * uVar5 | (uint)(iVar60 >= (int)uVar5) * iVar60;
  uVar156 = (iVar112 < (int)uVar5) * uVar5 | (uint)(iVar112 >= (int)uVar5) * iVar112;
  uVar162 = (iVar116 < (int)uVar5) * uVar5 | (uint)(iVar116 >= (int)uVar5) * iVar116;
  uVar164 = (iVar120 < (int)uVar5) * uVar5 | (uint)(iVar120 >= (int)uVar5) * iVar120;
  uVar166 = (iVar131 < (int)uVar5) * uVar5 | (uint)(iVar131 >= (int)uVar5) * iVar131;
  uVar124 = (iVar73 < (int)uVar5) * uVar5 | (uint)(iVar73 >= (int)uVar5) * iVar73;
  uVar128 = (iVar74 < (int)uVar5) * uVar5 | (uint)(iVar74 >= (int)uVar5) * iVar74;
  uVar129 = (iVar75 < (int)uVar5) * uVar5 | (uint)(iVar75 >= (int)uVar5) * iVar75;
  uVar130 = (iVar79 < (int)uVar5) * uVar5 | (uint)(iVar79 >= (int)uVar5) * iVar79;
  uVar178 = (iVar149 < (int)uVar5) * uVar5 | (uint)(iVar149 >= (int)uVar5) * iVar149;
  uVar188 = (iVar151 < (int)uVar5) * uVar5 | (uint)(iVar151 >= (int)uVar5) * iVar151;
  uVar191 = (iVar153 < (int)uVar5) * uVar5 | (uint)(iVar153 >= (int)uVar5) * iVar153;
  uVar194 = (iVar155 < (int)uVar5) * uVar5 | (uint)(iVar155 >= (int)uVar5) * iVar155;
  uVar95 = (iVar62 < (int)uVar5) * uVar5 | (uint)(iVar62 >= (int)uVar5) * iVar62;
  uVar99 = (iVar66 < (int)uVar5) * uVar5 | (uint)(iVar66 >= (int)uVar5) * iVar66;
  uVar101 = (iVar67 < (int)uVar5) * uVar5 | (uint)(iVar67 >= (int)uVar5) * iVar67;
  uVar103 = (iVar72 < (int)uVar5) * uVar5 | (uint)(iVar72 >= (int)uVar5) * iVar72;
  uVar54 = (iVar92 < (int)uVar5) * uVar5 | (uint)(iVar92 >= (int)uVar5) * iVar92;
  uVar64 = (iVar16 < (int)uVar5) * uVar5 | (uint)(iVar16 >= (int)uVar5) * iVar16;
  uVar70 = (iVar21 < (int)uVar5) * uVar5 | (uint)(iVar21 >= (int)uVar5) * iVar21;
  uVar77 = (iVar25 < (int)uVar5) * uVar5 | (uint)(iVar25 >= (int)uVar5) * iVar25;
  auVar90._0_4_ = (uint)(iVar175 < (int)uVar132) * iVar175 | (iVar175 >= (int)uVar132) * uVar132;
  auVar90._4_4_ = (uint)(iVar175 < (int)uVar138) * iVar175 | (iVar175 >= (int)uVar138) * uVar138;
  auVar90._8_4_ = (uint)(iVar175 < (int)uVar140) * iVar175 | (iVar175 >= (int)uVar140) * uVar140;
  auVar90._12_4_ = (uint)(iVar175 < (int)uVar142) * iVar175 | (iVar175 >= (int)uVar142) * uVar142;
  uVar5 = (uint)(iVar175 < (int)uVar32) * iVar175 | (iVar175 >= (int)uVar32) * uVar32;
  auVar58._0_4_ = (uint)(iVar175 < (int)uVar106) * iVar175 | (iVar175 >= (int)uVar106) * uVar106;
  auVar58._4_4_ = (uint)(iVar175 < (int)uVar114) * iVar175 | (iVar175 >= (int)uVar114) * uVar114;
  auVar58._8_4_ = (uint)(iVar175 < (int)uVar118) * iVar175 | (iVar175 >= (int)uVar118) * uVar118;
  auVar58._12_4_ = (uint)(iVar175 < (int)uVar122) * iVar175 | (iVar175 >= (int)uVar122) * uVar122;
  auVar148._0_4_ = (uint)(iVar175 < (int)uVar144) * iVar175 | (iVar175 >= (int)uVar144) * uVar144;
  auVar148._4_4_ = (uint)(iVar175 < (int)uVar150) * iVar175 | (iVar175 >= (int)uVar150) * uVar150;
  auVar148._8_4_ = (uint)(iVar175 < (int)uVar152) * iVar175 | (iVar175 >= (int)uVar152) * uVar152;
  auVar148._12_4_ = (uint)(iVar175 < (int)uVar154) * iVar175 | (iVar175 >= (int)uVar154) * uVar154;
  auVar33._0_4_ = (uint)(iVar175 < (int)uVar107) * iVar175 | (iVar175 >= (int)uVar107) * uVar107;
  auVar33._4_4_ = (uint)(iVar175 < (int)uVar115) * iVar175 | (iVar175 >= (int)uVar115) * uVar115;
  auVar33._8_4_ = (uint)(iVar175 < (int)uVar119) * iVar175 | (iVar175 >= (int)uVar119) * uVar119;
  auVar33._12_4_ = (uint)(iVar175 < (int)uVar123) * iVar175 | (iVar175 >= (int)uVar123) * uVar123;
  auVar136._0_4_ = (uint)(iVar175 < (int)uVar177) * iVar175 | (iVar175 >= (int)uVar177) * uVar177;
  auVar136._4_4_ = (uint)(iVar175 < (int)uVar187) * iVar175 | (iVar175 >= (int)uVar187) * uVar187;
  auVar136._8_4_ = (uint)(iVar175 < (int)uVar190) * iVar175 | (iVar175 >= (int)uVar190) * uVar190;
  auVar136._12_4_ = (uint)(iVar175 < (int)uVar193) * iVar175 | (iVar175 >= (int)uVar193) * uVar193;
  auVar160._0_4_ = (uint)(iVar175 < (int)uVar156) * iVar175 | (iVar175 >= (int)uVar156) * uVar156;
  auVar160._4_4_ = (uint)(iVar175 < (int)uVar162) * iVar175 | (iVar175 >= (int)uVar162) * uVar162;
  auVar160._8_4_ = (uint)(iVar175 < (int)uVar164) * iVar175 | (iVar175 >= (int)uVar164) * uVar164;
  auVar160._12_4_ = (uint)(iVar175 < (int)uVar166) * iVar175 | (iVar175 >= (int)uVar166) * uVar166;
  auVar184._0_4_ = (uint)(iVar175 < (int)uVar178) * iVar175 | (iVar175 >= (int)uVar178) * uVar178;
  auVar184._4_4_ = (uint)(iVar175 < (int)uVar188) * iVar175 | (iVar175 >= (int)uVar188) * uVar188;
  auVar184._8_4_ = (uint)(iVar175 < (int)uVar191) * iVar175 | (iVar175 >= (int)uVar191) * uVar191;
  auVar184._12_4_ = (uint)(iVar175 < (int)uVar194) * iVar175 | (iVar175 >= (int)uVar194) * uVar194;
  auVar185._0_4_ = (uint)(iVar175 < (int)uVar54) * iVar175 | (iVar175 >= (int)uVar54) * uVar54;
  auVar185._4_4_ = (uint)(iVar175 < (int)uVar64) * iVar175 | (iVar175 >= (int)uVar64) * uVar64;
  auVar185._8_4_ = (uint)(iVar175 < (int)uVar70) * iVar175 | (iVar175 >= (int)uVar70) * uVar70;
  auVar185._12_4_ = (uint)(iVar175 < (int)uVar77) * iVar175 | (iVar175 >= (int)uVar77) * uVar77;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1e0);
  auVar111._4_4_ = uVar1;
  auVar111._0_4_ = uVar1;
  auVar111._8_4_ = uVar1;
  auVar111._12_4_ = uVar1;
  auVar11 = pmulld(auVar90,auVar111);
  auVar17 = pmulld(auVar58,auVar111);
  iVar91 = auVar11._0_4_ + iVar6;
  iVar92 = auVar11._4_4_ + iVar6;
  iVar93 = auVar11._8_4_ + iVar6;
  iVar13 = auVar11._12_4_ + iVar6;
  auVar10 = pmulld(auVar148,auVar111);
  auVar11 = pmulld(auVar33,auVar111);
  iVar4 = auVar10._0_4_ + iVar6;
  iVar7 = auVar10._4_4_ + iVar6;
  iVar8 = auVar10._8_4_ + iVar6;
  iVar9 = auVar10._12_4_ + iVar6;
  auVar10 = pmulld(auVar136,auVar111);
  auVar40 = pmulld(auVar160,auVar111);
  iVar14 = auVar10._0_4_ + iVar6;
  iVar16 = auVar10._4_4_ + iVar6;
  iVar21 = auVar10._8_4_ + iVar6;
  iVar23 = auVar10._12_4_ + iVar6;
  auVar10 = pmulld(auVar184,auVar111);
  auVar39 = pmulld(auVar185,auVar111);
  iVar167 = auVar10._0_4_ + iVar6;
  iVar171 = auVar10._4_4_ + iVar6;
  iVar173 = auVar10._8_4_ + iVar6;
  iVar6 = auVar10._12_4_ + iVar6;
  iVar15 = iVar14 - auVar40._0_4_ >> auVar126;
  iVar20 = iVar16 - auVar40._4_4_ >> auVar126;
  iVar22 = iVar21 - auVar40._8_4_ >> auVar126;
  iVar24 = iVar23 - auVar40._12_4_ >> auVar126;
  if (do_cols == 0) {
    bVar2 = 10;
    if (10 < bd) {
      bVar2 = (byte)bd;
    }
    iVar167 = 0x20 << (bVar2 & 0x1f);
    clamp_lo_out[0]._0_4_ = -iVar167;
    auVar195._0_8_ = (__m128i *)CONCAT44(iVar20,iVar15);
    auVar195._8_4_ = iVar22;
    auVar195._12_4_ = iVar24;
    clamp_hi_out[0]._0_4_ = iVar167 + -1;
    in1[1] = (longlong)clamp_hi_out;
    in1[0] = (longlong)clamp_lo_out;
    in0[1] = (longlong)(out + 1);
    in0[0] = (longlong)out;
    clamp_hi_out[0]._4_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._0_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._4_4_ = (int)clamp_hi_out[0];
    clamp_lo_out[0]._4_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._0_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._4_4_ = (int)clamp_lo_out[0];
    neg_shift_sse4_1(in0,in1,out0,out1,auVar195._0_8_,auVar195._8_8_,uVar5);
    in1_00[1] = (longlong)clamp_hi_out;
    in1_00[0] = (longlong)clamp_lo_out;
    in0_00[1] = (longlong)(out + 3);
    in0_00[0] = (longlong)(out + 2);
    neg_shift_sse4_1(in0_00,in1_00,out0,out1,auVar195._0_8_,auVar195._8_8_,uVar5);
    in1_01[1] = (longlong)clamp_hi_out;
    in1_01[0] = (longlong)clamp_lo_out;
    in0_01[1] = (longlong)(out + 5);
    in0_01[0] = (longlong)(out + 4);
    neg_shift_sse4_1(in0_01,in1_01,out0,out1,auVar195._0_8_,auVar195._8_8_,uVar5);
    in1_02[1] = (longlong)clamp_hi_out;
    in1_02[0] = (longlong)clamp_lo_out;
    in0_02[1] = (longlong)(out + 7);
    in0_02[0] = (longlong)(out + 6);
    neg_shift_sse4_1(in0_02,in1_02,out0,out1,auVar195._0_8_,auVar195._8_8_,uVar5);
    in1_03[1] = (longlong)clamp_hi_out;
    in1_03[0] = (longlong)clamp_lo_out;
    in0_03[1] = (longlong)(out + 9);
    in0_03[0] = (longlong)(out + 8);
    neg_shift_sse4_1(in0_03,in1_03,out0,out1,auVar195._0_8_,auVar195._8_8_,uVar5);
    in1_04[1] = (longlong)clamp_hi_out;
    in1_04[0] = (longlong)clamp_lo_out;
    in0_04[1] = (longlong)(out + 0xb);
    in0_04[0] = (longlong)(out + 10);
    neg_shift_sse4_1(in0_04,in1_04,out0,out1,auVar195._0_8_,auVar195._8_8_,uVar5);
    in1_05[1] = (longlong)clamp_hi_out;
    in1_05[0] = (longlong)clamp_lo_out;
    in0_05[1] = (longlong)(out + 0xd);
    in0_05[0] = (longlong)(out + 0xc);
    neg_shift_sse4_1(in0_05,in1_05,out0,out1,auVar195._0_8_,auVar195._8_8_,uVar5);
    in1_06[1] = (longlong)clamp_hi_out;
    in1_06[0] = (longlong)clamp_lo_out;
    in0_06[1] = (longlong)(out + 0xf);
    in0_06[0] = (longlong)(out + 0xe);
    neg_shift_sse4_1(in0_06,in1_06,out0,out1,auVar195._0_8_,auVar195._8_8_,uVar5);
  }
  else {
    (*out)[0] = CONCAT44((uint)(iVar175 < (int)uVar63) * iVar175 | (iVar175 >= (int)uVar63) * uVar63
                         ,(uint)(iVar175 < (int)uVar53) * iVar175 |
                          (iVar175 >= (int)uVar53) * uVar53);
    (*out)[1] = CONCAT44((uint)(iVar175 < (int)uVar76) * iVar175 | (iVar175 >= (int)uVar76) * uVar76
                         ,(uint)(iVar175 < (int)uVar69) * iVar175 |
                          (iVar175 >= (int)uVar69) * uVar69);
    *(uint *)out[1] =
         -((uint)(iVar175 < (int)uVar168) * iVar175 | (iVar175 >= (int)uVar168) * uVar168);
    *(uint *)((long)out[1] + 4) =
         -((uint)(iVar175 < (int)uVar172) * iVar175 | (iVar175 >= (int)uVar172) * uVar172);
    *(uint *)(out[1] + 1) =
         -((uint)(iVar175 < (int)uVar174) * iVar175 | (iVar175 >= (int)uVar174) * uVar174);
    *(uint *)((long)out[1] + 0xc) =
         -((uint)(iVar175 < (int)uVar176) * iVar175 | (iVar175 >= (int)uVar176) * uVar176);
    out[2][0] = CONCAT44((uint)(iVar175 < (int)uVar128) * iVar175 |
                         (iVar175 >= (int)uVar128) * uVar128,
                         (uint)(iVar175 < (int)uVar124) * iVar175 |
                         (iVar175 >= (int)uVar124) * uVar124);
    out[2][1] = CONCAT44((uint)(iVar175 < (int)uVar130) * iVar175 |
                         (iVar175 >= (int)uVar130) * uVar130,
                         (uint)(iVar175 < (int)uVar129) * iVar175 |
                         (iVar175 >= (int)uVar129) * uVar129);
    *(uint *)out[3] = -((uint)(iVar175 < (int)uVar38) * iVar175 | (iVar175 >= (int)uVar38) * uVar38)
    ;
    *(uint *)((long)out[3] + 4) =
         -((uint)(iVar175 < (int)uVar44) * iVar175 | (iVar175 >= (int)uVar44) * uVar44);
    *(uint *)(out[3] + 1) =
         -((uint)(iVar175 < (int)uVar46) * iVar175 | (iVar175 >= (int)uVar46) * uVar46);
    *(uint *)((long)out[3] + 0xc) =
         -((uint)(iVar175 < (int)uVar48) * iVar175 | (iVar175 >= (int)uVar48) * uVar48);
    *(int *)out[4] = iVar4 + auVar11._0_4_ >> auVar126;
    *(int *)((long)out[4] + 4) = iVar7 + auVar11._4_4_ >> auVar126;
    *(int *)(out[4] + 1) = iVar8 + auVar11._8_4_ >> auVar126;
    *(int *)((long)out[4] + 0xc) = iVar9 + auVar11._12_4_ >> auVar126;
    *(int *)out[5] = -(iVar167 + auVar39._0_4_ >> auVar126);
    *(int *)((long)out[5] + 4) = -(iVar171 + auVar39._4_4_ >> auVar126);
    *(int *)(out[5] + 1) = -(iVar173 + auVar39._8_4_ >> auVar126);
    *(int *)((long)out[5] + 0xc) = -(iVar6 + auVar39._12_4_ >> auVar126);
    *(int *)out[6] = iVar14 + auVar40._0_4_ >> auVar126;
    *(int *)((long)out[6] + 4) = iVar16 + auVar40._4_4_ >> auVar126;
    *(int *)(out[6] + 1) = iVar21 + auVar40._8_4_ >> auVar126;
    *(int *)((long)out[6] + 0xc) = iVar23 + auVar40._12_4_ >> auVar126;
    *(int *)out[7] = -(iVar91 + auVar17._0_4_ >> auVar126);
    *(int *)((long)out[7] + 4) = -(iVar92 + auVar17._4_4_ >> auVar126);
    *(int *)(out[7] + 1) = -(iVar93 + auVar17._8_4_ >> auVar126);
    *(int *)((long)out[7] + 0xc) = -(iVar13 + auVar17._12_4_ >> auVar126);
    *(int *)out[8] = iVar91 - auVar17._0_4_ >> auVar126;
    *(int *)((long)out[8] + 4) = iVar92 - auVar17._4_4_ >> auVar126;
    *(int *)(out[8] + 1) = iVar93 - auVar17._8_4_ >> auVar126;
    *(int *)((long)out[8] + 0xc) = iVar13 - auVar17._12_4_ >> auVar126;
    *(int *)out[9] = -iVar15;
    *(int *)((long)out[9] + 4) = -iVar20;
    *(int *)(out[9] + 1) = -iVar22;
    *(int *)((long)out[9] + 0xc) = -iVar24;
    *(int *)out[10] = iVar167 - auVar39._0_4_ >> auVar126;
    *(int *)((long)out[10] + 4) = iVar171 - auVar39._4_4_ >> auVar126;
    *(int *)(out[10] + 1) = iVar173 - auVar39._8_4_ >> auVar126;
    *(int *)((long)out[10] + 0xc) = iVar6 - auVar39._12_4_ >> auVar126;
    *(int *)out[0xb] = -(iVar4 - auVar11._0_4_ >> auVar126);
    *(int *)((long)out[0xb] + 4) = -(iVar7 - auVar11._4_4_ >> auVar126);
    *(int *)(out[0xb] + 1) = -(iVar8 - auVar11._8_4_ >> auVar126);
    *(int *)((long)out[0xb] + 0xc) = -(iVar9 - auVar11._12_4_ >> auVar126);
    out[0xc][0] = CONCAT44((uint)(iVar175 < (int)uVar113) * iVar175 |
                           (iVar175 >= (int)uVar113) * uVar113,
                           (uint)(iVar175 < (int)uVar105) * iVar175 |
                           (iVar175 >= (int)uVar105) * uVar105);
    out[0xc][1] = CONCAT44((uint)(iVar175 < (int)uVar121) * iVar175 |
                           (iVar175 >= (int)uVar121) * uVar121,
                           (uint)(iVar175 < (int)uVar117) * iVar175 |
                           (iVar175 >= (int)uVar117) * uVar117);
    *(uint *)out[0xd] =
         -((uint)(iVar175 < (int)uVar95) * iVar175 | (iVar175 >= (int)uVar95) * uVar95);
    *(uint *)((long)out[0xd] + 4) =
         -((uint)(iVar175 < (int)uVar99) * iVar175 | (iVar175 >= (int)uVar99) * uVar99);
    *(uint *)(out[0xd] + 1) =
         -((uint)(iVar175 < (int)uVar101) * iVar175 | (iVar175 >= (int)uVar101) * uVar101);
    *(uint *)((long)out[0xd] + 0xc) =
         -((uint)(iVar175 < (int)uVar103) * iVar175 | (iVar175 >= (int)uVar103) * uVar103);
    out[0xe][0] = CONCAT44((uint)(iVar175 < (int)uVar84) * iVar175 |
                           (iVar175 >= (int)uVar84) * uVar84,
                           (uint)(iVar175 < (int)uVar80) * iVar175 |
                           (iVar175 >= (int)uVar80) * uVar80);
    out[0xe][1] = CONCAT44((uint)(iVar175 < (int)uVar88) * iVar175 |
                           (iVar175 >= (int)uVar88) * uVar88,
                           (uint)(iVar175 < (int)uVar86) * iVar175 |
                           (iVar175 >= (int)uVar86) * uVar86);
    *(uint *)out[0xf] = -uVar5;
    *(uint *)((long)out[0xf] + 4) =
         -((uint)(iVar175 < (int)uVar34) * iVar175 | (iVar175 >= (int)uVar34) * uVar34);
    *(uint *)(out[0xf] + 1) =
         -((uint)(iVar175 < (int)uVar35) * iVar175 | (iVar175 >= (int)uVar35) * uVar35);
    *(uint *)((long)out[0xf] + 0xc) =
         -((uint)(iVar175 < (int)uVar36) * iVar175 | (iVar175 >= (int)uVar36) * uVar36);
  }
  return;
}

Assistant:

static void iadst16x16_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi18 = _mm_set1_epi32(cospi[18]);
  const __m128i cospi46 = _mm_set1_epi32(cospi[46]);
  const __m128i cospi26 = _mm_set1_epi32(cospi[26]);
  const __m128i cospi38 = _mm_set1_epi32(cospi[38]);
  const __m128i cospi34 = _mm_set1_epi32(cospi[34]);
  const __m128i cospi30 = _mm_set1_epi32(cospi[30]);
  const __m128i cospi42 = _mm_set1_epi32(cospi[42]);
  const __m128i cospi22 = _mm_set1_epi32(cospi[22]);
  const __m128i cospi50 = _mm_set1_epi32(cospi[50]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi58 = _mm_set1_epi32(cospi[58]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i zero = _mm_setzero_si128();
  __m128i u[16], x, y;

  // stage 0
  // stage 1
  // stage 2
  x = _mm_mullo_epi32(in[0], cospi62);
  u[0] = _mm_add_epi32(x, rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  x = _mm_mullo_epi32(in[0], cospi2);
  u[1] = _mm_sub_epi32(zero, x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  x = _mm_mullo_epi32(in[2], cospi54);
  u[2] = _mm_add_epi32(x, rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  x = _mm_mullo_epi32(in[2], cospi10);
  u[3] = _mm_sub_epi32(zero, x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  x = _mm_mullo_epi32(in[4], cospi46);
  u[4] = _mm_add_epi32(x, rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  x = _mm_mullo_epi32(in[4], cospi18);
  u[5] = _mm_sub_epi32(zero, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  x = _mm_mullo_epi32(in[6], cospi38);
  u[6] = _mm_add_epi32(x, rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  x = _mm_mullo_epi32(in[6], cospi26);
  u[7] = _mm_sub_epi32(zero, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  u[8] = _mm_mullo_epi32(in[7], cospi34);
  u[8] = _mm_add_epi32(u[8], rnding);
  u[8] = _mm_srai_epi32(u[8], bit);

  u[9] = _mm_mullo_epi32(in[7], cospi30);
  u[9] = _mm_add_epi32(u[9], rnding);
  u[9] = _mm_srai_epi32(u[9], bit);

  u[10] = _mm_mullo_epi32(in[5], cospi42);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  u[11] = _mm_mullo_epi32(in[5], cospi22);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  u[12] = _mm_mullo_epi32(in[3], cospi50);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);

  u[13] = _mm_mullo_epi32(in[3], cospi14);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  u[14] = _mm_mullo_epi32(in[1], cospi58);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  u[15] = _mm_mullo_epi32(in[1], cospi6);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 3
  addsub_sse4_1(u[0], u[8], &u[0], &u[8], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[9], &u[1], &u[9], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[10], &u[2], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[11], &u[3], &u[11], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[12], &u[4], &u[12], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[13], &u[5], &u[13], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[6], u[14], &u[6], &u[14], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[7], u[15], &u[7], &u[15], &clamp_lo, &clamp_hi);

  // stage 4
  y = _mm_mullo_epi32(u[8], cospi56);
  x = _mm_mullo_epi32(u[9], cospi56);
  u[8] = _mm_mullo_epi32(u[8], cospi8);
  u[8] = _mm_add_epi32(u[8], x);
  u[8] = _mm_add_epi32(u[8], rnding);
  u[8] = _mm_srai_epi32(u[8], bit);

  x = _mm_mullo_epi32(u[9], cospi8);
  u[9] = _mm_sub_epi32(y, x);
  u[9] = _mm_add_epi32(u[9], rnding);
  u[9] = _mm_srai_epi32(u[9], bit);

  x = _mm_mullo_epi32(u[11], cospi24);
  y = _mm_mullo_epi32(u[10], cospi24);
  u[10] = _mm_mullo_epi32(u[10], cospi40);
  u[10] = _mm_add_epi32(u[10], x);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  x = _mm_mullo_epi32(u[11], cospi40);
  u[11] = _mm_sub_epi32(y, x);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  x = _mm_mullo_epi32(u[13], cospi8);
  y = _mm_mullo_epi32(u[12], cospi8);
  u[12] = _mm_mullo_epi32(u[12], cospim56);
  u[12] = _mm_add_epi32(u[12], x);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);

  x = _mm_mullo_epi32(u[13], cospim56);
  u[13] = _mm_sub_epi32(y, x);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  x = _mm_mullo_epi32(u[15], cospi40);
  y = _mm_mullo_epi32(u[14], cospi40);
  u[14] = _mm_mullo_epi32(u[14], cospim24);
  u[14] = _mm_add_epi32(u[14], x);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  x = _mm_mullo_epi32(u[15], cospim24);
  u[15] = _mm_sub_epi32(y, x);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 5
  addsub_sse4_1(u[0], u[4], &u[0], &u[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &u[1], &u[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &u[2], &u[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &u[3], &u[7], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[8], u[12], &u[8], &u[12], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[9], u[13], &u[9], &u[13], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[10], u[14], &u[10], &u[14], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[11], u[15], &u[11], &u[15], &clamp_lo, &clamp_hi);

  // stage 6
  x = _mm_mullo_epi32(u[5], cospi48);
  y = _mm_mullo_epi32(u[4], cospi48);
  u[4] = _mm_mullo_epi32(u[4], cospi16);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  x = _mm_mullo_epi32(u[5], cospi16);
  u[5] = _mm_sub_epi32(y, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  x = _mm_mullo_epi32(u[7], cospi16);
  y = _mm_mullo_epi32(u[6], cospi16);
  u[6] = _mm_mullo_epi32(u[6], cospim48);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  x = _mm_mullo_epi32(u[7], cospim48);
  u[7] = _mm_sub_epi32(y, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  x = _mm_mullo_epi32(u[13], cospi48);
  y = _mm_mullo_epi32(u[12], cospi48);
  u[12] = _mm_mullo_epi32(u[12], cospi16);
  u[12] = _mm_add_epi32(u[12], x);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);

  x = _mm_mullo_epi32(u[13], cospi16);
  u[13] = _mm_sub_epi32(y, x);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  x = _mm_mullo_epi32(u[15], cospi16);
  y = _mm_mullo_epi32(u[14], cospi16);
  u[14] = _mm_mullo_epi32(u[14], cospim48);
  u[14] = _mm_add_epi32(u[14], x);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  x = _mm_mullo_epi32(u[15], cospim48);
  u[15] = _mm_sub_epi32(y, x);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 7
  addsub_sse4_1(u[0], u[2], &u[0], &u[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &u[1], &u[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &u[4], &u[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &u[5], &u[7], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[8], u[10], &u[8], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[9], u[11], &u[9], &u[11], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[12], u[14], &u[12], &u[14], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[13], u[15], &u[13], &u[15], &clamp_lo, &clamp_hi);

  // stage 8
  y = _mm_mullo_epi32(u[2], cospi32);
  x = _mm_mullo_epi32(u[3], cospi32);
  u[2] = _mm_add_epi32(y, x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(y, x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);
  y = _mm_mullo_epi32(u[6], cospi32);
  x = _mm_mullo_epi32(u[7], cospi32);
  u[6] = _mm_add_epi32(y, x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(y, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  y = _mm_mullo_epi32(u[10], cospi32);
  x = _mm_mullo_epi32(u[11], cospi32);
  u[10] = _mm_add_epi32(y, x);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  u[11] = _mm_sub_epi32(y, x);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  y = _mm_mullo_epi32(u[14], cospi32);
  x = _mm_mullo_epi32(u[15], cospi32);
  u[14] = _mm_add_epi32(y, x);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  u[15] = _mm_sub_epi32(y, x);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 9
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm_sub_epi32(zero, u[8]);
    out[2] = u[12];
    out[3] = _mm_sub_epi32(zero, u[4]);
    out[4] = u[6];
    out[5] = _mm_sub_epi32(zero, u[14]);
    out[6] = u[10];
    out[7] = _mm_sub_epi32(zero, u[2]);
    out[8] = u[3];
    out[9] = _mm_sub_epi32(zero, u[11]);
    out[10] = u[15];
    out[11] = _mm_sub_epi32(zero, u[7]);
    out[12] = u[5];
    out[13] = _mm_sub_epi32(zero, u[13]);
    out[14] = u[9];
    out[15] = _mm_sub_epi32(zero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[8], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[12], u[4], out + 2, out + 3, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[6], u[14], out + 4, out + 5, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[10], u[2], out + 6, out + 7, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[3], u[11], out + 8, out + 9, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[15], u[7], out + 10, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[5], u[13], out + 12, out + 13, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[9], u[1], out + 14, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }
}